

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_extension.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,string *root_class_name,FieldDescriptor *descriptor)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  
  ExtensionMethodName_abi_cxx11_(&this->method_name_,(objectivec *)descriptor,descriptor);
  pcVar2 = (root_class_name->_M_dataplus)._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + root_class_name->_M_string_length);
  std::__cxx11::string::append((char *)local_40);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_40,(ulong)(this->method_name_)._M_dataplus._M_p);
  paVar1 = &(this->root_class_and_method_name_).field_2;
  (this->root_class_and_method_name_)._M_dataplus._M_p = (pointer)paVar1;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar3 = plVar5[3];
    paVar1->_M_allocated_capacity = *psVar6;
    *(long *)((long)&(this->root_class_and_method_name_).field_2 + 8) = lVar3;
  }
  else {
    (this->root_class_and_method_name_)._M_dataplus._M_p = (pointer)*plVar5;
    (this->root_class_and_method_name_).field_2._M_allocated_capacity = *psVar6;
  }
  (this->root_class_and_method_name_)._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  this->descriptor_ = descriptor;
  bVar4 = FieldDescriptor::is_map(descriptor);
  if (!bVar4) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"error: Extension is a map<>!",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," That used to be blocked by the compiler.",0x29);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  std::ostream::flush();
  abort();
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const string& root_class_name,
                                       const FieldDescriptor* descriptor)
    : method_name_(ExtensionMethodName(descriptor)),
      root_class_and_method_name_(root_class_name + "_" + method_name_),
      descriptor_(descriptor) {
  if (descriptor->is_map()) {
    // NOTE: src/google/protobuf/compiler/plugin.cc makes use of cerr for some
    // error cases, so it seems to be ok to use as a back door for errors.
    cerr << "error: Extension is a map<>!"
         << " That used to be blocked by the compiler." << endl;
    cerr.flush();
    abort();
  }
}